

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O3

void __thiscall interfaces_tests::findCommonAncestor::test_method(findCommonAncestor *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  int *piVar1;
  CKey *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppCVar4;
  uint256 *puVar5;
  Chain *pCVar6;
  lazy_ostream *plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar13;
  Chainstate *pCVar14;
  Chainstate *this_01;
  CBlockIndex *pindex;
  int iVar15;
  char *pcVar16;
  iterator in_R9;
  iterator pvVar17;
  iterator pvVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar25;
  CBlockIndex *local_410;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 local_368 [16];
  undefined1 *local_358;
  undefined1 *local_350;
  assertion_result local_348;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  int orig_height;
  int fork_height;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 local_238 [9];
  undefined7 uStack_22f;
  pointer local_228;
  char *pcStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  undefined8 uStack_1f8;
  undefined1 uStack_1f0;
  undefined7 uStack_1ef;
  assertion_result local_1e8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [24];
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined1 uStack_170;
  undefined7 uStack_16f;
  undefined8 local_168;
  undefined1 uStack_160;
  undefined7 uStack_15f;
  BlockValidationState state;
  uint256 orig_hash;
  uint256 active_hash;
  uint256 fork_hash;
  CBlock local_a8;
  long local_38;
  
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)state.super_ValidationState<BlockValidationResult>._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x65,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x65,"operator()","m_node.chainman");
  state.super_ValidationState<BlockValidationResult>._0_9_ = ZEXT89(0x13c1538);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
  pcVar16 = "m_node.chainman";
  puVar13 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                       ,0x65,"operator()","m_node.chainman");
  pCVar14 = ChainstateManager::ActiveChainstate
                      ((puVar13->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  ppCVar4 = (pCVar14->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_410 = (CBlockIndex *)0x0;
  }
  else {
    local_410 = ppCVar4[-1];
  }
  paVar2 = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  iVar15 = 10;
  paVar3 = &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  do {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = paVar2;
    state.super_ValidationState<BlockValidationResult>._0_16_ = auVar12 << 0x40;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_9_ = ZEXT89(0);
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)paVar3;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    this_01 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar4 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar4 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pindex = (CBlockIndex *)0x0;
    }
    else {
      pindex = ppCVar4[-1];
    }
    Chainstate::InvalidateBlock(this_01,&state,pindex);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        paVar3) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
        paVar2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p,state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                            field_2._M_allocated_capacity + 1);
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6b;
  file.m_begin = (iterator)&local_248;
  msg.m_end = in_R9;
  msg.m_begin = pcVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_258,msg);
  local_238[8] = false;
  local_238._0_8_ = &PTR__lazy_ostream_013ae088;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  pcStack_220 = "";
  local_1e8._0_4_ =
       (int)((ulong)((long)(pCVar14->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar14->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  local_368._0_4_ = local_410->nHeight + -10;
  fork_hash.super_base_blob<256U>.m_data._M_elems[0] = local_1e8._0_4_ == local_368._0_4_;
  fork_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xd7;
  active_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xef;
  active_hash.super_base_blob<256U>.m_data._M_elems[2] = 0xe9;
  active_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[8] = '9';
  active_hash.super_base_blob<256U>.m_data._M_elems[9] = 0xf0;
  active_hash.super_base_blob<256U>.m_data._M_elems[10] = 0xe9;
  active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&local_1e8;
  orig_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)&local_1e8 >> 8);
  orig_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)&local_1e8 >> 0x10);
  orig_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)&local_1e8 >> 0x18);
  orig_hash.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)&local_1e8 >> 0x20);
  orig_hash.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)&local_1e8 >> 0x28);
  orig_hash.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)&local_1e8 >> 0x30);
  orig_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)&local_1e8 >> 0x38);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae248;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&orig_hash;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_1a8[8] = '\0';
  uStack_190 = (undefined8 *)local_1c8;
  local_1c8._0_8_ = local_368;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar17 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&fork_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xe9f2be,
             (size_t)&active_hash,0x6b,&state,"orig_tip->nHeight - 10",local_1a8);
  piVar1 = &local_410->nHeight;
  boost::detail::shared_count::~shared_count
            ((shared_count *)(fork_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).coinbaseKey;
  CKey::MakeNewKey(this_00,true);
  iVar15 = 0x14;
  do {
    local_238._0_8_ = (pointer)0x0;
    local_238[8] = false;
    uStack_22f = 0;
    local_228 = (pointer)0x0;
    CKey::GetPubKey((CPubKey *)&state,this_00);
    GetScriptForRawPubKey((CScript *)local_1a8,(CPubKey *)&state);
    pvVar18 = (iterator)0x0;
    TestChain100Setup::CreateAndProcessBlock
              (&local_a8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,
               (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_238,
               (CScript *)local_1a8,(Chainstate *)0x0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_a8.vtx);
    if ((undefined1 *)0x1cffffffff < uStack_190) {
      free((void *)local_1a8._0_8_);
    }
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_238);
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x70;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar17;
  msg_00.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  local_238[8] = false;
  local_238._0_8_ = &PTR__lazy_ostream_013ae088;
  local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
  pcStack_220 = "";
  local_1e8._0_4_ =
       (int)((ulong)((long)(pCVar14->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar14->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  fork_hash.super_base_blob<256U>.m_data._M_elems[0] = local_1e8._0_4_ == *piVar1 + 10;
  local_368._0_4_ = *piVar1 + 10;
  orig_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&local_1e8;
  orig_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)&local_1e8 >> 8);
  orig_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)&local_1e8 >> 0x10);
  orig_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)&local_1e8 >> 0x18);
  orig_hash.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)&local_1e8 >> 0x20);
  orig_hash.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)&local_1e8 >> 0x28);
  orig_hash.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)&local_1e8 >> 0x30);
  orig_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)&local_1e8 >> 0x38);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae248;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&orig_hash;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_1a8[8] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1a8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_190 = (undefined8 *)local_1c8;
  active_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xd7;
  active_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xef;
  active_hash.super_base_blob<256U>.m_data._M_elems[2] = 0xe9;
  active_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[8] = '9';
  active_hash.super_base_blob<256U>.m_data._M_elems[9] = 0xf0;
  active_hash.super_base_blob<256U>.m_data._M_elems[10] = 0xe9;
  active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_1c8._0_8_ = local_368;
  pvVar17 = (iterator)0x1;
  pvVar18 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&fork_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xe9f2be,
             (size_t)&active_hash,0x70,&state,"orig_tip->nHeight + 10",(CScript *)local_1a8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(fork_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x74;
  file_01.m_begin = (iterator)&local_290;
  msg_01.m_end = pvVar18;
  msg_01.m_begin = pvVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a0,
             msg_01);
  puVar5 = local_410->phashBlock;
  local_1e8._0_8_ = (uint256 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_);
  if (puVar5 != (uint256 *)0x0) {
    pCVar6 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    uVar8 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
    uVar9 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    uVar10 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    uVar11 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar10;
    active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)((ulong)uVar10 >> 8);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)((ulong)uVar10 >> 0x10);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)((ulong)uVar10 >> 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)((ulong)uVar10 >> 0x20);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)((ulong)uVar10 >> 0x28);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)((ulong)uVar10 >> 0x30);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)((ulong)uVar10 >> 0x38);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar11;
    active_hash.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar11 >> 8);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar11 >> 0x10);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar11 >> 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar11 >> 0x20);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar11 >> 0x28);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar11 >> 0x30);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar11 >> 0x38);
    active_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)uVar8;
    active_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)uVar8 >> 8);
    active_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)uVar8 >> 0x10);
    active_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)uVar8 >> 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)uVar8 >> 0x20);
    active_hash.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)uVar8 >> 0x28);
    active_hash.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)uVar8 >> 0x30);
    active_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)uVar8 >> 0x38);
    active_hash.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uVar9;
    active_hash.super_base_blob<256U>.m_data._M_elems[9] = (uchar)((ulong)uVar9 >> 8);
    active_hash.super_base_blob<256U>.m_data._M_elems[10] = (uchar)((ulong)uVar9 >> 0x10);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)((ulong)uVar9 >> 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)((ulong)uVar9 >> 0x20);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)((ulong)uVar9 >> 0x28);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)((ulong)uVar9 >> 0x30);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)((ulong)uVar9 >> 0x38);
    puVar5 = (pCVar14->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    local_1e8._0_8_ = (uint256 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_);
    if (puVar5 != (uint256 *)0x0) {
      uVar10 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
      uVar11 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
      uVar8 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
      uVar9 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar8;
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)((ulong)uVar8 >> 8);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)((ulong)uVar8 >> 0x10);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)((ulong)uVar8 >> 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)((ulong)uVar8 >> 0x20);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)((ulong)uVar8 >> 0x28);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)((ulong)uVar8 >> 0x30);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)((ulong)uVar8 >> 0x38);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar9;
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar9 >> 8);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar9 >> 0x10);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar9 >> 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar9 >> 0x20);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar9 >> 0x28);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar9 >> 0x30);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar9 >> 0x38);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)uVar10;
      orig_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)uVar10 >> 8);
      orig_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)uVar10 >> 0x10);
      orig_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)uVar10 >> 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)uVar10 >> 0x20);
      orig_hash.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)uVar10 >> 0x28);
      orig_hash.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)uVar10 >> 0x30);
      orig_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)uVar10 >> 0x38);
      orig_hash.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uVar11;
      orig_hash.super_base_blob<256U>.m_data._M_elems[9] = (uchar)((ulong)uVar11 >> 8);
      orig_hash.super_base_blob<256U>.m_data._M_elems[10] = (uchar)((ulong)uVar11 >> 0x10);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)((ulong)uVar11 >> 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)((ulong)uVar11 >> 0x20);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)((ulong)uVar11 >> 0x28);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)((ulong)uVar11 >> 0x30);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)((ulong)uVar11 >> 0x38);
      stack0xfffffffffffffee8 = SUB169((undefined1  [16])0x0,0);
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
           '\0';
      state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity._1_7_ = 0;
      state.super_ValidationState<BlockValidationResult>._32_16_ = (undefined1  [16])0x0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_16_ =
           (undefined1  [16])0x0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)&fork_height;
      state.super_ValidationState<BlockValidationResult>._0_8_ = &fork_hash;
      local_1a8._0_8_ = (char *)0x0;
      local_168 = 0;
      uStack_160 = 0;
      uStack_15f = 0;
      local_178 = 0;
      uStack_170 = 0;
      uStack_16f = 0;
      local_188 = 0;
      uStack_180 = 0;
      local_1a8._16_8_ = 0;
      uStack_190._0_4_ = 0;
      uStack_190._4_4_ = 0;
      local_1a8[8] = SUB81(&orig_height,0);
      local_1a8._9_7_ = (undefined7)((ulong)&orig_height >> 8);
      uStack_1f8 = 0;
      uStack_1f0 = 0;
      uStack_208 = 0;
      local_200 = 0;
      uStack_1ff = 0;
      local_218 = 0;
      uStack_210 = 0;
      local_228 = (pointer)0x0;
      pcStack_220 = (char *)0x0;
      local_238._0_8_ = (pointer)0x0;
      local_238[8] = false;
      uStack_22f = 0;
      _cVar25 = 0x3fb98b;
      iVar15 = (*pCVar6->_vptr_Chain[0xe])(pCVar6,&active_hash);
      local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)SUB41(iVar15,0);
      local_1e8.m_message.px = (element_type *)0x0;
      local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_368._0_8_ =
           "chain->findCommonAncestor(orig_tip->GetBlockHash(), active.Tip()->GetBlockHash(), FoundBlock().height(fork_height).hash(fork_hash), FoundBlock().height(orig_height))"
      ;
      local_368._8_8_ = "";
      local_1c8[8] = 0;
      local_1c8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_1b8._8_8_ = local_368;
      local_1b8._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_2b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_2a8 = "";
      pvVar17 = (iterator)0x1;
      pvVar18 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1e8,(lazy_ostream *)local_1c8,1,0,WARN,_cVar25,(size_t)&local_2b0,0x74);
      boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
      local_2c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_2b8 = "";
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = &DAT_00000075;
      file_02.m_begin = (iterator)&local_2c0;
      msg_02.m_end = pvVar18;
      msg_02.m_begin = pvVar17;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d0,
                 msg_02);
      local_238[8] = false;
      local_238._0_8_ = &PTR__lazy_ostream_013ae088;
      local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
      pcStack_220 = "";
      active_hash.super_base_blob<256U>.m_data._M_elems[0] = orig_height == *piVar1;
      active_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xd7;
      orig_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xef;
      orig_hash.super_base_blob<256U>.m_data._M_elems[2] = 0xe9;
      orig_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[8] = '9';
      orig_hash.super_base_blob<256U>.m_data._M_elems[9] = 0xf0;
      orig_hash.super_base_blob<256U>.m_data._M_elems[10] = 0xe9;
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_1c8._0_8_ = &orig_height;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
      state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae248;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
           (size_type)boost::unit_test::lazy_ostream::inst;
      local_1a8[8] = '\0';
      local_1a8._0_8_ = &PTR__lazy_ostream_013ae248;
      local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
      uStack_190 = (undefined8 *)&local_1e8;
      pvVar17 = (iterator)0x1;
      pvVar18 = (iterator)0x2;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)(lazy_ostream *)local_1c8;
      local_1e8._0_8_ = piVar1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&active_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xe9f795,
                 (size_t)&orig_hash,0x75,&state,"orig_tip->nHeight",local_1a8);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(active_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_2e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_2d8 = "";
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x76;
      file_03.m_begin = (iterator)&local_2e0;
      msg_03.m_end = pvVar18;
      msg_03.m_begin = pvVar17;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f0,
                 msg_03);
      local_238[8] = false;
      local_238._0_8_ = &PTR__lazy_ostream_013ae088;
      local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
      pcStack_220 = "";
      active_hash.super_base_blob<256U>.m_data._M_elems[0] = fork_height == *piVar1 + -10;
      local_368._0_4_ = *piVar1 + -10;
      active_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xd7;
      orig_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xef;
      orig_hash.super_base_blob<256U>.m_data._M_elems[2] = 0xe9;
      orig_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[8] = '9';
      orig_hash.super_base_blob<256U>.m_data._M_elems[9] = 0xf0;
      orig_hash.super_base_blob<256U>.m_data._M_elems[10] = 0xe9;
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_1c8._0_8_ = &fork_height;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
      state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013ae248;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
           (size_type)boost::unit_test::lazy_ostream::inst;
      local_1e8._0_8_ = local_368;
      local_1a8[8] = '\0';
      local_1a8._0_8_ = &PTR__lazy_ostream_013ae248;
      local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
      pvVar17 = (iterator)0x1;
      pvVar18 = (iterator)0x2;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)(lazy_ostream *)local_1c8;
      uStack_190 = (undefined8 *)&local_1e8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&active_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xe9f7b3,
                 (size_t)&orig_hash,0x76,&state,"orig_tip->nHeight - 10",local_1a8);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(active_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_300 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_2f8 = "";
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      local_308 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x77;
      file_04.m_begin = (iterator)&local_300;
      msg_04.m_end = pvVar18;
      msg_04.m_begin = pvVar17;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_310,
                 msg_04);
      local_238[8] = false;
      local_238._0_8_ = &PTR__lazy_ostream_013ae088;
      local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
      pcStack_220 = "";
      puVar5 = (pCVar14->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)fork_height]->phashBlock;
      if (puVar5 != (uint256 *)0x0) {
        active_hash.super_base_blob<256U>.m_data._M_elems[0] =
             *(uchar *)&puVar5->super_base_blob<256U>;
        active_hash.super_base_blob<256U>.m_data._M_elems[1] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[1];
        active_hash.super_base_blob<256U>.m_data._M_elems[2] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[2];
        active_hash.super_base_blob<256U>.m_data._M_elems[3] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[3];
        active_hash.super_base_blob<256U>.m_data._M_elems[4] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[4];
        active_hash.super_base_blob<256U>.m_data._M_elems[5] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[5];
        active_hash.super_base_blob<256U>.m_data._M_elems[6] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[6];
        active_hash.super_base_blob<256U>.m_data._M_elems[7] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[7];
        active_hash.super_base_blob<256U>.m_data._M_elems[8] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[8];
        active_hash.super_base_blob<256U>.m_data._M_elems[9] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[9];
        active_hash.super_base_blob<256U>.m_data._M_elems[10] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[10];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xb];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xc];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xd];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xe];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xf];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x10];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x11];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x12];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x13];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x14];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x15];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x16];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x17];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x18];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x19];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1a];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1b];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1c];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1d];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1e];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1f];
        auVar22[0] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar22[1] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar22[2] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar22[3] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar22[4] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar22[5] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar22[6] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar22[7] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar22[8] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar22[9] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar22[10] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       fork_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar22[0xb] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar22[0xc] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar22[0xd] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar22[0xe] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar22[0xf] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar19[0] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0]);
        auVar19[1] = -(active_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[1]);
        auVar19[2] = -(active_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[2]);
        auVar19[3] = -(active_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[3]);
        auVar19[4] = -(active_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[4]);
        auVar19[5] = -(active_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[5]);
        auVar19[6] = -(active_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[6]);
        auVar19[7] = -(active_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[7]);
        auVar19[8] = -(active_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[8]);
        auVar19[9] = -(active_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[9]);
        auVar19[10] = -(active_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                       fork_hash.super_base_blob<256U>.m_data._M_elems[10]);
        auVar19[0xb] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar19[0xc] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar19[0xd] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar19[0xe] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar19[0xf] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar19 = auVar19 & auVar22;
        orig_hash.super_base_blob<256U>.m_data._M_elems[0] =
             (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff;
        orig_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_1c8._8_8_ = "";
        local_1c8._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
        ;
        local_1e8._0_8_ = &fork_hash;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ =
             0;
        state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013aed38;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
             (size_type)boost::unit_test::lazy_ostream::inst;
        local_1a8[8] = '\0';
        local_1a8._0_8_ = &PTR__lazy_ostream_013aed38;
        local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
        uStack_190 = (undefined8 *)local_368;
        pvVar17 = (iterator)0x1;
        pvVar18 = (iterator)0x2;
        local_368._0_8_ = (assertion_result *)&active_hash;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)&local_1e8;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&orig_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xe9f7bf,
                   (size_t)local_1c8,0x77,&state,"active[fork_height]->GetBlockHash()",local_1a8);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)(orig_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
        active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        local_320 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
        ;
        local_318 = "";
        local_330 = &boost::unit_test::basic_cstring<char_const>::null;
        local_328 = &boost::unit_test::basic_cstring<char_const>::null;
        file_05.m_end = (iterator)0x7a;
        file_05.m_begin = (iterator)&local_320;
        msg_05.m_end = pvVar18;
        msg_05.m_begin = pvVar17;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_330
                   ,msg_05);
        plVar7 = (lazy_ostream *)
                 (pCVar14->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->phashBlock;
        if (plVar7 != (lazy_ostream *)0x0) {
          local_1c8 = *(undefined1 (*) [16])plVar7;
          local_1b8 = *(undefined1 (*) [16])(plVar7 + 1);
          local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          uStack_1d0 = 0;
          local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)0x0;
          local_1e8._1_3_ = 0;
          local_1e8._4_4_ = 0;
          local_1e8.m_message.px = (element_type *)0x0;
          stack0xfffffffffffffee8 = SUB169((undefined1  [16])0x0,7);
          state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
          state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0]
               = '\0';
          state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity._1_7_ = 0;
          state.super_ValidationState<BlockValidationResult>._32_16_ = (undefined1  [16])0x0;
          state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = 0;
          state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
          state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
          state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)0x0;
          uStack_160 = 0;
          uStack_15f = 0;
          uStack_170 = 0;
          uStack_16f = 0;
          local_168 = 0;
          uStack_180 = 0;
          local_178 = 0;
          uStack_190._0_4_ = 0;
          uStack_190._4_4_ = 0;
          local_188 = 0;
          local_1a8[8] = '\0';
          local_1a8._9_7_ = 0;
          local_1a8._16_8_ = (undefined1 *)0x0;
          uStack_1f8 = 0;
          uStack_1f0 = 0;
          uStack_208 = 0;
          local_200 = 0;
          uStack_1ff = 0;
          local_218 = 0;
          uStack_210 = 0;
          local_228 = (pointer)0x0;
          pcStack_220 = (char *)0x0;
          local_238._0_8_ = (pointer)0x0;
          local_238[8] = false;
          uStack_22f = 0;
          _cVar25 = 0x3fbfc1;
          local_1a8._0_8_ = (assertion_result *)&active_hash;
          iVar15 = (*((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                      super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                      .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain
                     [0xe])();
          local_348._0_8_ = CONCAT71(local_348._1_7_,(char)iVar15) ^ 1;
          local_348.m_message.px = (element_type *)0x0;
          local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_350 = (undefined1 *)&local_378;
          local_378 = 
          "!chain->findCommonAncestor(active.Tip()->GetBlockHash(), {}, {}, FoundBlock().hash(active_hash), {})"
          ;
          local_370 = "";
          local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
          local_368._0_8_ = &PTR__lazy_ostream_013ae1c8;
          local_358 = boost::unit_test::lazy_ostream::inst;
          local_388 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
          ;
          local_380 = "";
          pvVar17 = (iterator)0x1;
          pvVar18 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_348,(lazy_ostream *)local_368,1,0,WARN,_cVar25,(size_t)&local_388,0x7a);
          boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
          local_398 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
          ;
          local_390 = "";
          local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0x7b;
          file_06.m_begin = (iterator)&local_398;
          msg_06.m_end = pvVar18;
          msg_06.m_begin = pvVar17;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_3a8,msg_06);
          pCVar6 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                   super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                   .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
          local_1b8._0_8_ = (_func_int **)0x0;
          local_1b8[8] = false;
          local_1b8._9_7_ = 0;
          local_1c8._0_8_ = (_func_int **)0x0;
          local_1c8[8] = false;
          local_1c8._9_7_ = 0;
          puVar5 = local_410->phashBlock;
          if (puVar5 != (uint256 *)0x0) {
            uVar8 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
            local_1e8.m_message.px =
                 *(element_type **)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
            local_1e8.m_message.pn.pi_ =
                 *(sp_counted_base **)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
            uStack_1d0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
            local_1e8._0_4_ = SUB84(uVar8,0);
            local_1e8._4_4_ = SUB84((ulong)uVar8 >> 0x20,0);
            stack0xfffffffffffffee8 = SUB169((undefined1  [16])0x0,7);
            state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
            state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf
            [0] = '\0';
            state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._1_7_ = 0;
            state.super_ValidationState<BlockValidationResult>._32_16_ = (undefined1  [16])0x0;
            state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
            state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = 0;
            state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
            state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
            state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)0x0;
            local_168 = 0;
            uStack_160 = 0;
            local_178 = 0;
            uStack_170 = 0;
            uStack_16f = 0;
            local_188 = 0;
            uStack_180 = 0;
            local_1a8._16_8_ = (undefined1 *)0x0;
            uStack_190._0_4_ = 0;
            uStack_190._4_4_ = 0;
            local_1a8._0_8_ = (assertion_result *)0x0;
            local_1a8[8] = '\0';
            local_1a8._9_7_ = 0;
            uStack_1f0 = 0;
            uStack_1ef = 0;
            local_200 = 0;
            uStack_1ff = 0;
            uStack_1f8 = 0;
            uStack_210 = 0;
            uStack_208 = 0;
            pcStack_220 = (char *)0x0;
            local_218 = 0;
            local_238[8] = false;
            uStack_22f = 0;
            local_228 = (pointer)0x0;
            local_238._0_8_ = &orig_hash;
            _cVar25 = 0x3fc16a;
            iVar15 = (*pCVar6->_vptr_Chain[0xe])(pCVar6,local_1c8,&local_1e8,&state,local_1a8);
            local_348._0_8_ = CONCAT71(local_348._1_7_,(char)iVar15) ^ 1;
            local_348.m_message.px = (element_type *)0x0;
            local_348.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_378 = 
            "!chain->findCommonAncestor({}, orig_tip->GetBlockHash(), {}, {}, FoundBlock().hash(orig_hash))"
            ;
            local_370 = "";
            local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
            local_368._0_8_ = &PTR__lazy_ostream_013ae1c8;
            local_358 = boost::unit_test::lazy_ostream::inst;
            local_350 = (undefined1 *)&local_378;
            local_3b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
            ;
            local_3b0 = "";
            pvVar17 = (iterator)0x1;
            pvVar18 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_348,(lazy_ostream *)local_368,1,0,WARN,_cVar25,(size_t)&local_3b8,0x7b
                      );
            boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
            local_3c8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
            ;
            local_3c0 = "";
            local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_07.m_end = (iterator)0x7c;
            file_07.m_begin = (iterator)&local_3c8;
            msg_07.m_end = pvVar18;
            msg_07.m_begin = pvVar17;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                       (size_t)&local_3d8,msg_07);
            local_238[8] = false;
            local_238._0_8_ = &PTR__lazy_ostream_013ae088;
            local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
            pcStack_220 = "";
            plVar7 = (lazy_ostream *)
                     (pCVar14->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1]->phashBlock;
            if (plVar7 != (lazy_ostream *)0x0) {
              local_1c8 = *(undefined1 (*) [16])plVar7;
              local_1b8 = *(undefined1 (*) [16])(plVar7 + 1);
              auVar23[0] = -(*(uchar *)&plVar7[1]._vptr_lazy_ostream ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
              auVar23[1] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 1) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
              auVar23[2] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 2) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
              auVar23[3] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 3) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
              auVar23[4] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 4) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
              auVar23[5] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 5) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
              auVar23[6] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 6) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
              auVar23[7] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 7) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
              auVar23[8] = -(plVar7[1].m_empty ==
                            (bool)active_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
              auVar23[9] = -(plVar7[1].field_0x9 ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
              auVar23[10] = -(plVar7[1].field_0xa ==
                             active_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
              auVar23[0xb] = -(plVar7[1].field_0xb ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
              auVar23[0xc] = -(plVar7[1].field_0xc ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
              auVar23[0xd] = -(plVar7[1].field_0xd ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
              auVar23[0xe] = -(plVar7[1].field_0xe ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
              auVar23[0xf] = -(plVar7[1].field_0xf ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
              auVar20[0] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[0]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[0]);
              auVar20[1] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[1]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[1]);
              auVar20[2] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[2]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[2]);
              auVar20[3] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[3]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[3]);
              auVar20[4] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[4]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[4]);
              auVar20[5] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[5]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[5]);
              auVar20[6] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[6]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[6]);
              auVar20[7] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[7]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[7]);
              auVar20[8] = -(plVar7->m_empty ==
                            (bool)active_hash.super_base_blob<256U>.m_data._M_elems[8]);
              auVar20[9] = -(plVar7->field_0x9 ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[9]);
              auVar20[10] = -(plVar7->field_0xa ==
                             active_hash.super_base_blob<256U>.m_data._M_elems[10]);
              auVar20[0xb] = -(plVar7->field_0xb ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
              auVar20[0xc] = -(plVar7->field_0xc ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
              auVar20[0xd] = -(plVar7->field_0xd ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
              auVar20[0xe] = -(plVar7->field_0xe ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
              auVar20[0xf] = -(plVar7->field_0xf ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
              auVar20 = auVar20 & auVar23;
              local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)
                      (readonly_property<bool>)
                      ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
              local_1e8.m_message.px = (element_type *)0x0;
              local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_368._0_8_ =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
              ;
              local_368._8_8_ = "";
              local_348._0_8_ = &active_hash;
              state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p.
              _0_1_ = 0;
              state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013aed38
              ;
              state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity = (size_type)&local_348;
              state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
                   (size_type)boost::unit_test::lazy_ostream::inst;
              local_378 = local_1c8;
              local_1a8[8] = '\0';
              local_1a8._0_8_ = &PTR__lazy_ostream_013aed38;
              local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
              uStack_190 = &local_378;
              pvVar17 = (iterator)0x1;
              pvVar18 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        (&local_1e8,(lazy_ostream *)local_238,1,2,REQUIRE,0xe9f8b1,(size_t)local_368
                         ,0x7c,&state,"active.Tip()->GetBlockHash()",local_1a8);
              boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
              local_3e8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
              ;
              local_3e0 = "";
              local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_08.m_end = (iterator)0x7d;
              file_08.m_begin = (iterator)&local_3e8;
              msg_08.m_end = pvVar18;
              msg_08.m_begin = pvVar17;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                         (size_t)&local_3f8,msg_08);
              local_238[8] = false;
              local_238._0_8_ = &PTR__lazy_ostream_013ae088;
              local_228 = (pointer)boost::unit_test::lazy_ostream::inst;
              pcStack_220 = "";
              plVar7 = (lazy_ostream *)local_410->phashBlock;
              local_1e8._0_8_ = (uint256 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_);
              if (plVar7 != (lazy_ostream *)0x0) {
                local_1c8 = *(undefined1 (*) [16])plVar7;
                local_1b8 = *(undefined1 (*) [16])(plVar7 + 1);
                auVar24[0] = -(*(uchar *)&plVar7[1]._vptr_lazy_ostream ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
                auVar24[1] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 1) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
                auVar24[2] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 2) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
                auVar24[3] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 3) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
                auVar24[4] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 4) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
                auVar24[5] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 5) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
                auVar24[6] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 6) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
                auVar24[7] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 7) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
                auVar24[8] = -(plVar7[1].m_empty ==
                              (bool)orig_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
                auVar24[9] = -(plVar7[1].field_0x9 ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
                auVar24[10] = -(plVar7[1].field_0xa ==
                               orig_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
                auVar24[0xb] = -(plVar7[1].field_0xb ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
                auVar24[0xc] = -(plVar7[1].field_0xc ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
                auVar24[0xd] = -(plVar7[1].field_0xd ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
                auVar24[0xe] = -(plVar7[1].field_0xe ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
                auVar24[0xf] = -(plVar7[1].field_0xf ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
                auVar21[0] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [0] == orig_hash.super_base_blob<256U>.m_data._M_elems[0]);
                auVar21[1] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [1] == orig_hash.super_base_blob<256U>.m_data._M_elems[1]);
                auVar21[2] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [2] == orig_hash.super_base_blob<256U>.m_data._M_elems[2]);
                auVar21[3] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [3] == orig_hash.super_base_blob<256U>.m_data._M_elems[3]);
                auVar21[4] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [4] == orig_hash.super_base_blob<256U>.m_data._M_elems[4]);
                auVar21[5] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [5] == orig_hash.super_base_blob<256U>.m_data._M_elems[5]);
                auVar21[6] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [6] == orig_hash.super_base_blob<256U>.m_data._M_elems[6]);
                auVar21[7] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [7] == orig_hash.super_base_blob<256U>.m_data._M_elems[7]);
                auVar21[8] = -(plVar7->m_empty ==
                              (bool)orig_hash.super_base_blob<256U>.m_data._M_elems[8]);
                auVar21[9] = -(plVar7->field_0x9 ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[9]);
                auVar21[10] = -(plVar7->field_0xa ==
                               orig_hash.super_base_blob<256U>.m_data._M_elems[10]);
                auVar21[0xb] = -(plVar7->field_0xb ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
                auVar21[0xc] = -(plVar7->field_0xc ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
                auVar21[0xd] = -(plVar7->field_0xd ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
                auVar21[0xe] = -(plVar7->field_0xe ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
                auVar21[0xf] = -(plVar7->field_0xf ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
                auVar21 = auVar21 & auVar24;
                local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)
                         (readonly_property<bool>)
                         ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
                local_1e8.m_message.px = (element_type *)0x0;
                local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_368._0_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                ;
                local_368._8_8_ = "";
                local_348._0_8_ = &orig_hash;
                state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p.
                _0_1_ = 0;
                state.super_ValidationState<BlockValidationResult>._0_8_ =
                     &PTR__lazy_ostream_013aed38;
                state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)&local_348;
                state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length
                     = (size_type)boost::unit_test::lazy_ostream::inst;
                local_378 = local_1c8;
                local_1a8[8] = '\0';
                local_1a8._0_8_ = &PTR__lazy_ostream_013aed38;
                local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
                uStack_190 = &local_378;
                boost::test_tools::tt_detail::report_assertion
                          (&local_1e8,(lazy_ostream *)local_238,1,2,REQUIRE,0xe9f8da,
                           (size_t)local_368,0x7d,&state,"orig_tip->GetBlockHash()",local_1a8);
                boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
                if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
                  __stack_chk_fail();
                }
                return;
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(findCommonAncestor)
{
    auto& chain = m_node.chain;
    const CChain& active{*WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return &Assert(m_node.chainman)->ActiveChain())};
    auto* orig_tip = active.Tip();
    for (int i = 0; i < 10; ++i) {
        BlockValidationState state;
        m_node.chainman->ActiveChainstate().InvalidateBlock(state, active.Tip());
    }
    BOOST_CHECK_EQUAL(active.Height(), orig_tip->nHeight - 10);
    coinbaseKey.MakeNewKey(true);
    for (int i = 0; i < 20; ++i) {
        CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    }
    BOOST_CHECK_EQUAL(active.Height(), orig_tip->nHeight + 10);
    uint256 fork_hash;
    int fork_height;
    int orig_height;
    BOOST_CHECK(chain->findCommonAncestor(orig_tip->GetBlockHash(), active.Tip()->GetBlockHash(), FoundBlock().height(fork_height).hash(fork_hash), FoundBlock().height(orig_height)));
    BOOST_CHECK_EQUAL(orig_height, orig_tip->nHeight);
    BOOST_CHECK_EQUAL(fork_height, orig_tip->nHeight - 10);
    BOOST_CHECK_EQUAL(fork_hash, active[fork_height]->GetBlockHash());

    uint256 active_hash, orig_hash;
    BOOST_CHECK(!chain->findCommonAncestor(active.Tip()->GetBlockHash(), {}, {}, FoundBlock().hash(active_hash), {}));
    BOOST_CHECK(!chain->findCommonAncestor({}, orig_tip->GetBlockHash(), {}, {}, FoundBlock().hash(orig_hash)));
    BOOST_CHECK_EQUAL(active_hash, active.Tip()->GetBlockHash());
    BOOST_CHECK_EQUAL(orig_hash, orig_tip->GetBlockHash());
}